

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

int __thiscall yyFlexLexer::yy_get_next_buffer(yyFlexLexer *this)

{
  char *pcVar1;
  size_t sVar2;
  yy_buffer_state **ppyVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  yy_buffer_state *pyVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  pcVar8 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
  pcVar1 = (this->super_FlexLexer).yytext;
  if (pcVar8 + (long)this->yy_n_chars + 1 < this->yy_c_buf_p) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
              (this,"fatal flex scanner internal error--end of buffer missed");
  }
  pcVar6 = (this->super_FlexLexer).yytext;
  if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_fill_buffer == 0) {
    iVar5 = ((long)this->yy_c_buf_p - (long)pcVar6 != 1) + 1;
  }
  else {
    uVar11 = ~(uint)pcVar6 + (int)this->yy_c_buf_p;
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        pcVar8[lVar9] = pcVar1[lVar9];
        lVar9 = lVar9 + 1;
      } while (uVar11 != (uint)lVar9);
    }
    pyVar7 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    if (pyVar7->yy_buffer_status == 2) {
      this->yy_n_chars = 0;
      iVar5 = 0;
    }
    else {
      while (uVar4 = pyVar7->yy_buf_size + ~uVar11, (int)uVar4 < 1) {
        pcVar8 = this->yy_c_buf_p;
        pyVar7 = this->yy_buffer_stack[this->yy_buffer_stack_top];
        pcVar1 = pyVar7->yy_ch_buf;
        if (pyVar7->yy_is_our_buffer == 0) {
          pcVar6 = (char *)0x0;
        }
        else {
          iVar5 = pyVar7->yy_buf_size;
          iVar12 = iVar5;
          if (iVar5 < 1) {
            iVar12 = iVar5 + 7;
            if (-1 < iVar5) {
              iVar12 = iVar5;
            }
            iVar12 = iVar12 >> 3;
          }
          pyVar7->yy_buf_size = iVar12 + iVar5;
          pcVar6 = (char *)realloc(pcVar1,(long)(iVar12 + iVar5 + 2));
        }
        pyVar7->yy_ch_buf = pcVar6;
        if (pcVar6 == (char *)0x0) {
          (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                    (this,"fatal error - scanner input buffer overflow");
        }
        this->yy_c_buf_p = pyVar7->yy_ch_buf + ((int)pcVar8 - (int)pcVar1);
        pyVar7 = this->yy_buffer_stack[this->yy_buffer_stack_top];
      }
      uVar10 = 0x2000;
      if ((int)uVar4 < 0x2000) {
        uVar10 = (ulong)uVar4;
      }
      iVar5 = (*(this->super_FlexLexer)._vptr_FlexLexer[0xc])
                        (this,this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf +
                              (int)uVar11,uVar10);
      this->yy_n_chars = iVar5;
      if (iVar5 < 0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"input in flex scanner failed");
      }
      iVar5 = this->yy_n_chars;
      pyVar7 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    pyVar7->yy_n_chars = iVar5;
    iVar5 = 0;
    if (this->yy_n_chars == 0) {
      if (uVar11 == 0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
        iVar5 = 1;
      }
      else {
        this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buffer_status = 2;
        iVar5 = 2;
      }
    }
    iVar12 = this->yy_n_chars + uVar11;
    if (this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size < iVar12) {
      iVar12 = iVar12 + (this->yy_n_chars >> 1);
      pcVar8 = (char *)realloc(this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf,
                               (long)iVar12);
      sVar2 = this->yy_buffer_stack_top;
      ppyVar3 = this->yy_buffer_stack;
      ppyVar3[sVar2]->yy_ch_buf = pcVar8;
      if (ppyVar3[sVar2]->yy_ch_buf == (char *)0x0) {
        (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                  (this,"out of dynamic memory in yy_get_next_buffer()");
      }
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size = iVar12 + -2;
    }
    lVar9 = (long)(int)uVar11 + (long)this->yy_n_chars;
    this->yy_n_chars = (int)lVar9;
    this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf[lVar9] = '\0';
    this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf[(long)this->yy_n_chars + 1] = '\0';
    (this->super_FlexLexer).yytext = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
  }
  return iVar5;
}

Assistant:

int yyFlexLexer::yy_get_next_buffer()
/* %endif */
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}